

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O3

void __thiscall D5xNvmFlash::command(D5xNvmFlash *this,uint8_t cmd)

{
  byte bVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000031;
  
  waitReady(this);
  Samba::writeWord((this->super_Flash)._samba,0x41004004,
                   (uint)CONCAT71(in_register_00000031,cmd) | 0xa500);
  waitReady(this);
  bVar1 = Samba::readByte((this->super_Flash)._samba,0x41004010);
  Samba::readByte((this->super_Flash)._samba,0x41004011);
  if ((bVar1 & 0xce) == 0) {
    return;
  }
  writeRegU16(this,'\x10',0xce);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_001187c8;
  __cxa_throw(puVar2,&FlashCmdError::typeinfo,std::exception::~exception);
}

Assistant:

void
D5xNvmFlash::command(uint8_t cmd)
{
    waitReady();

    writeRegU32(NVM_REG_CTRLB, CMDEX_KEY | cmd);

    waitReady();

    if (readRegU16(NVM_REG_INTFLAG) & 0xce)
    {
        // Clear the error bits
        writeRegU16(NVM_REG_INTFLAG, 0xce);
        throw FlashCmdError();
    }
}